

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

void __thiscall cbtDbvt::optimizeBottomUp(cbtDbvt *this)

{
  tNodeArray leaves;
  
  if (this->m_root != (cbtDbvtNode *)0x0) {
    leaves.m_ownsMemory = true;
    leaves.m_data = (cbtDbvtNode **)0x0;
    leaves.m_size = 0;
    leaves.m_capacity = 0;
    cbtAlignedObjectArray<cbtDbvtNode_*>::reserve(&leaves,this->m_leaves);
    fetchleaves(this,this->m_root,&leaves,-1);
    bottomup(this,leaves.m_data,leaves.m_size);
    this->m_root = *leaves.m_data;
    cbtAlignedObjectArray<cbtDbvtNode_*>::~cbtAlignedObjectArray(&leaves);
  }
  return;
}

Assistant:

void cbtDbvt::optimizeBottomUp()
{
	if (m_root)
	{
		tNodeArray leaves;
		leaves.reserve(m_leaves);
		fetchleaves(this, m_root, leaves);
		bottomup(this, &leaves[0], leaves.size());
		m_root = leaves[0];
	}
}